

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O0

VP8StatusCode WebPIAppend(WebPIDecoder *idec,uint8_t *data,size_t data_size)

{
  int iVar1;
  WebPIDecoder *in_RSI;
  WebPIDecoder *in_RDI;
  VP8StatusCode status;
  size_t in_stack_00000038;
  uint8_t *in_stack_00000040;
  WebPIDecoder *in_stack_00000048;
  VP8StatusCode local_4;
  
  if ((in_RDI == (WebPIDecoder *)0x0) || (in_RSI == (WebPIDecoder *)0x0)) {
    local_4 = VP8_STATUS_INVALID_PARAM;
  }
  else {
    local_4 = IDecCheckStatus(in_RDI);
    if (local_4 == VP8_STATUS_SUSPENDED) {
      iVar1 = CheckMemBufferMode(&in_RDI->mem,MEM_MODE_APPEND);
      if (iVar1 == 0) {
        local_4 = VP8_STATUS_INVALID_PARAM;
      }
      else {
        iVar1 = AppendToMemBuffer(in_stack_00000048,in_stack_00000040,in_stack_00000038);
        if (iVar1 == 0) {
          local_4 = VP8_STATUS_OUT_OF_MEMORY;
        }
        else {
          local_4 = IDecode(in_RSI);
        }
      }
    }
  }
  return local_4;
}

Assistant:

VP8StatusCode WebPIAppend(WebPIDecoder* idec,
                          const uint8_t* data, size_t data_size) {
  VP8StatusCode status;
  if (idec == NULL || data == NULL) {
    return VP8_STATUS_INVALID_PARAM;
  }
  status = IDecCheckStatus(idec);
  if (status != VP8_STATUS_SUSPENDED) {
    return status;
  }
  // Check mixed calls between RemapMemBuffer and AppendToMemBuffer.
  if (!CheckMemBufferMode(&idec->mem, MEM_MODE_APPEND)) {
    return VP8_STATUS_INVALID_PARAM;
  }
  // Append data to memory buffer
  if (!AppendToMemBuffer(idec, data, data_size)) {
    return VP8_STATUS_OUT_OF_MEMORY;
  }
  return IDecode(idec);
}